

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_profiler.c
# Opt level: O0

SUNErrCode SUNProfiler_Reset(SUNProfiler p)

{
  long in_RDI;
  sunTimerStruct *timer;
  int i;
  sunTimerStruct *entry;
  int local_14;
  SUNErrCode local_4;
  
  entry = (sunTimerStruct *)0x0;
  if (in_RDI == 0) {
    local_4 = -9999;
  }
  else {
    sunResetTiming(*(sunTimerStruct **)(in_RDI + 0x18));
    sunStartTiming((sunTimerStruct *)0x11343b);
    for (local_14 = 0; local_14 < *(int *)(*(long *)(in_RDI + 0x10) + 4); local_14 = local_14 + 1) {
      if ((*(long *)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + (long)local_14 * 8) != 0) &&
         (entry = *(sunTimerStruct **)
                   (*(long *)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + (long)local_14 * 8) + 8),
         entry != (sunTimerStruct *)0x0)) {
        sunResetTiming(entry);
      }
    }
    *(undefined8 *)(in_RDI + 0x20) = 0;
    sunStopTiming(entry);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SUNErrCode SUNProfiler_Reset(SUNProfiler p)
{
  int i                 = 0;
  sunTimerStruct* timer = NULL;

  if (!p) { return SUN_ERR_ARG_CORRUPT; }

  /* Reset the overhead timer */
  sunResetTiming(p->overhead);
  sunStartTiming(p->overhead);

  /* Reset all timers */
  for (i = 0; i < p->map->max_size; i++)
  {
    if (!(p->map->buckets[i])) { continue; }
    timer = p->map->buckets[i]->value;
    if (timer) { sunResetTiming(timer); }
  }

  /* Reset the overall timer. */
  p->sundials_time = 0.0;

  SUNDIALS_MARK_BEGIN(p, SUNDIALS_ROOT_TIMER);
  sunStopTiming(p->overhead);

  return SUN_SUCCESS;
}